

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void aom_paeth_predictor_16x8_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar15 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar14 [32];
  
  bVar1 = above[-1];
  auVar11[1] = 0;
  auVar11[0] = bVar1;
  auVar11[2] = bVar1;
  auVar11[3] = 0;
  auVar11[4] = bVar1;
  auVar11[5] = 0;
  auVar11[6] = bVar1;
  auVar11[7] = 0;
  auVar11[8] = bVar1;
  auVar11[9] = 0;
  auVar11[10] = bVar1;
  auVar11[0xb] = 0;
  auVar11[0xc] = bVar1;
  auVar11[0xd] = 0;
  auVar11[0xe] = bVar1;
  auVar11[0xf] = 0;
  auVar11[0x10] = bVar1;
  auVar11[0x11] = 0;
  auVar11[0x12] = bVar1;
  auVar11[0x13] = 0;
  auVar11[0x14] = bVar1;
  auVar11[0x15] = 0;
  auVar11[0x16] = bVar1;
  auVar11[0x17] = 0;
  auVar11[0x18] = bVar1;
  auVar11[0x19] = 0;
  auVar11[0x1a] = bVar1;
  auVar11[0x1b] = 0;
  auVar11[0x1c] = bVar1;
  auVar11[0x1d] = 0;
  auVar11[0x1e] = bVar1;
  auVar11[0x1f] = 0;
  auVar13 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  auVar2 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar12._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar13;
  auVar12._16_16_ = ZEXT116(1) * auVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)left;
  auVar14._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar13;
  auVar14._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
  auVar8 = vpsubw_avx2(auVar12,auVar11);
  auVar3 = vpabsw_avx2(auVar8);
  auVar15._8_8_ = 0x8000800080008000;
  auVar15._0_8_ = 0x8000800080008000;
  auVar15._16_8_ = 0x8000800080008000;
  auVar15._24_8_ = 0x8000800080008000;
  iVar10 = 8;
  auVar5 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
  do {
    auVar7 = vpshufb_avx2(auVar14,auVar15);
    auVar4 = vpaddw_avx2(auVar8,auVar7);
    auVar9 = vpsubw_avx2(auVar4,auVar12);
    auVar9 = vpabsw_avx2(auVar9);
    auVar4 = vpsubw_avx2(auVar4,auVar11);
    auVar4 = vpabsw_avx2(auVar4);
    auVar6 = vpminsw_avx2(auVar9,auVar4);
    auVar6 = vpcmpgtw_avx2(auVar3,auVar6);
    auVar9 = vpcmpgtw_avx2(auVar9,auVar4);
    auVar4 = vpandn_avx2(auVar6,auVar7);
    auVar9 = vpblendvb_avx2(auVar12,auVar11,auVar9);
    auVar9 = vpand_avx2(auVar6,auVar9);
    auVar9 = vpor_avx2(auVar9,auVar4);
    auVar13 = vpackuswb_avx(auVar9._0_16_,auVar9._16_16_);
    *(undefined1 (*) [16])dst = auVar13;
    dst = *(undefined1 (*) [16])dst + stride;
    auVar15 = vpsubw_avx2(auVar15,auVar5);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_16x8_avx2(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  __m128i x = _mm_loadl_epi64((const __m128i *)left);
  const __m256i l = _mm256_inserti128_si256(_mm256_castsi128_si256(x), x, 1);
  const __m256i tl16 = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i top = get_top_vector(above);

  int i;
  for (i = 0; i < 8; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}